

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_HasProperty
               (Var instance,PropertyId propertyId,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  JavascriptLibrary *this;
  undefined8 local_38;
  BOOL result;
  RecyclableObject *object;
  ScriptContext *scriptContext_local;
  PropertyId propertyId_local;
  Var instance_local;
  
  bVar1 = TaggedNumber::Is(instance);
  if (bVar1) {
    this = ScriptContext::GetLibrary(scriptContext);
    local_38 = JavascriptLibraryBase::GetNumberPrototype(&this->super_JavascriptLibraryBase);
  }
  else {
    local_38 = (DynamicObject *)VarTo<Js::RecyclableObject>(instance);
  }
  BVar2 = HasProperty(&local_38->super_RecyclableObject,propertyId);
  return BVar2;
}

Assistant:

BOOL JavascriptOperators::OP_HasProperty(Var instance, PropertyId propertyId, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_HasProperty);
        RecyclableObject* object = TaggedNumber::Is(instance) ?
            scriptContext->GetLibrary()->GetNumberPrototype() :
            VarTo<RecyclableObject>(instance);
        BOOL result = HasProperty(object, propertyId);
        return result;
        JIT_HELPER_END(Op_HasProperty);
    }